

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O3

TPZAutoPointer<TPZDohrAssembleItem<long_double>_> __thiscall
TPZDohrAssembleList<long_double>::PopItem(TPZDohrAssembleList<long_double> *this)

{
  list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
  *this_00;
  int iVar1;
  undefined8 *puVar2;
  int *in_RSI;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *(undefined4 *)(puVar2 + 1) = 0;
  *puVar2 = 0;
  LOCK();
  *(undefined4 *)(puVar2 + 1) = 1;
  UNLOCK();
  *(undefined8 **)this = puVar2;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x1a));
  if (iVar1 == 0) {
    this_00 = (list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
               *)(in_RSI + 0x2e);
    if (*(list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
          **)(in_RSI + 0x2e) != this_00) {
      *in_RSI = *in_RSI + -1;
      TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::operator=
                ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)this,
                 (TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)
                 &((*(list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                      **)(in_RSI + 0x2e))->
                  super__List_base<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                  )._M_impl._M_node._M_size);
      std::__cxx11::
      list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
      ::_M_erase(this_00,(this_00->
                         super__List_base<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x1a));
    return (TPZAutoPointer<TPZDohrAssembleItem<long_double>_>)(TPZReference *)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

TPZAutoPointer<TPZDohrAssembleItem<TVar> > TPZDohrAssembleList<TVar>::PopItem()
{
	TPZAutoPointer<TPZDohrAssembleItem<TVar> > result;
    std::lock_guard<std::mutex> lock(fListAccessLock);
	if (fWork.begin() != fWork.end()) {
		fNumItems--;
		result = *fWork.begin();
		fWork.pop_front();
	}
	return result;
}